

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int m_uncomp_copy(aec_stream_conflict *strm)

{
  uint uVar1;
  internal_state_conflict *piVar2;
  byte *pbVar3;
  uint32_t *puVar4;
  int iVar5;
  internal_state_conflict *state;
  size_t sVar6;
  ulong uVar7;
  
  piVar2 = strm->state;
  while( true ) {
    uVar1 = strm->bits_per_sample;
    iVar5 = piVar2->bitp;
    if (iVar5 < (int)uVar1) {
      sVar6 = strm->avail_in;
      do {
        sVar6 = sVar6 - 1;
        if (sVar6 == 0xffffffffffffffff) {
          return 0;
        }
        strm->avail_in = sVar6;
        uVar7 = piVar2->acc << 8;
        piVar2->acc = uVar7;
        pbVar3 = strm->next_in;
        strm->next_in = pbVar3 + 1;
        piVar2->acc = *pbVar3 | uVar7;
        iVar5 = iVar5 + 8;
        piVar2->bitp = iVar5;
      } while (iVar5 < (int)uVar1);
    }
    uVar7 = strm->avail_out;
    if (uVar7 < piVar2->bytes_per_sample) break;
    puVar4 = piVar2->rsip;
    piVar2->rsip = puVar4 + 1;
    *puVar4 = (uint)(piVar2->acc >> ((char)piVar2->bitp - (char)uVar1 & 0x3fU)) &
              (uint)(0xffffffffffffffff >> (-(char)uVar1 & 0x3fU));
    strm->avail_out = uVar7 - piVar2->bytes_per_sample;
    piVar2->bitp = piVar2->bitp - strm->bits_per_sample;
    puVar4 = &piVar2->sample_counter;
    *puVar4 = *puVar4 - 1;
    if (*puVar4 == 0) {
      piVar2->mode = m_next_cds;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int m_uncomp_copy(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    do {
        if (copysample(strm) == 0)
            return M_EXIT;
    } while(--state->sample_counter);

    state->mode = m_next_cds;
    return M_CONTINUE;
}